

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

pattern * setItem(void)

{
  pattern *rhs_00;
  pattern *rhs;
  pattern *lhs;
  
  rhs = limitItem();
  while ((((lookahead == 0x28 || (lookahead == 400)) || (lookahead == 0x191)) ||
         (((lookahead == 0x193 || (lookahead == 0x194)) || (lookahead == 0x2d))))) {
    rhs_00 = limitItem();
    rhs = makeNode(rhs,rhs_00,0x12d);
  }
  return rhs;
}

Assistant:

pattern* setItem() {
   pattern *lhs, *rhs;
   
   lhs = limitItem();
   for (;;) {
      if((lookahead == '(') /* a limitItem must begin with a feature! */
      || (lookahead == NOT_TOK)
      || (lookahead == NUM_TOK)
      || (lookahead ==  ID_TOK)
      || (lookahead == WITHIN_TOK)
      || (lookahead == '-')) {
	 rhs = limitItem();
	 lhs = makeNode(lhs, rhs, AND_NODE);
      }
      else {
	 break;
      }
   }
   return lhs;
}